

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

StringStream<4096UL,_4096UL> * __thiscall
spirv_cross::StringStream<4096UL,_4096UL>::operator<<(StringStream<4096UL,_4096UL> *this,uint32_t v)

{
  bool bVar1;
  uint uVar2;
  char cVar3;
  char cVar4;
  string s;
  char *local_40;
  uint local_38;
  undefined4 uStack_34;
  char local_30 [16];
  
  cVar4 = '\x01';
  if (9 < v) {
    uVar2 = v;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar2 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_0025e409;
      }
      if (uVar2 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_0025e409;
      }
      if (uVar2 < 10000) goto LAB_0025e409;
      bVar1 = 99999 < uVar2;
      uVar2 = uVar2 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar1);
    cVar4 = cVar4 + '\x01';
  }
LAB_0025e409:
  local_40 = local_30;
  ::std::__cxx11::string::_M_construct((ulong)&local_40,cVar4);
  ::std::__detail::__to_chars_10_impl<unsigned_int>(local_40,local_38,v);
  append(this,local_40,CONCAT44(uStack_34,local_38));
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return this;
}

Assistant:

StringStream &operator<<(uint32_t v)
	{
		auto s = std::to_string(v);
		append(s.data(), s.size());
		return *this;
	}